

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

void __thiscall IrSim::buildBB(IrSim *this)

{
  int *piVar1;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *this_00;
  int iVar2;
  pointer piVar3;
  iterator iVar4;
  int *piVar5;
  pointer psVar6;
  mapped_type_conflict *pmVar7;
  pointer pIVar8;
  ulong uVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  pointer piVar11;
  _Rb_tree_node_base *p_Var12;
  long lVar13;
  size_type sVar14;
  int *piVar15;
  long lVar16;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  int iVar17;
  pointer pIVar18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  int *piVar19;
  int labelNo;
  int local_58;
  int local_54;
  vector<int,std::allocator<int>> *local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_48;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_40;
  int local_34;
  
  local_58 = 0;
  pIVar18 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar8 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pIVar18 != pIVar8) {
    local_48 = &this->labels;
    local_50 = (vector<int,std::allocator<int>> *)&this->basicBlocks;
    local_40 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->functions;
    do {
      iVar2 = pIVar18->kind;
      if ((iVar2 - 0x14U < 8) || (iVar2 == 0xe)) {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](local_48,&(pIVar18->target).value);
        local_54 = *pmVar7;
        piVar3 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar11 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](&this->labelInBB,&local_54);
        *pmVar7 = (mapped_type_conflict)((ulong)((long)piVar3 - (long)piVar11) >> 2);
        iVar4._M_current =
             (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_50,iVar4,&local_54);
        }
        else {
          *iVar4._M_current = local_54;
          (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        local_34 = local_58 + 1;
        iVar4._M_current =
             (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_50,iVar4,&local_34);
        }
        else {
          *iVar4._M_current = local_34;
          (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
      }
      else if (iVar2 == 0xd) {
        iVar4._M_current =
             (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_50,iVar4,&local_58);
        }
        else {
          *iVar4._M_current = local_58;
          (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_40,&local_58);
      }
      local_58 = local_58 + 1;
      pIVar18 = pIVar18 + 1;
      pIVar8 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (pIVar18 != pIVar8);
  }
  local_54 = (int)((ulong)((long)pIVar8 -
                          (long)(this->irList).
                                super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3) * 0x286bca1b;
  iVar4._M_current =
       (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->basicBlocks,iVar4,&local_54);
  }
  else {
    *iVar4._M_current = local_54;
    (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  piVar15 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar5 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar15 != piVar5) {
    uVar9 = (long)piVar5 - (long)piVar15 >> 2;
    lVar13 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<IrSim::buildBB()::__0>>
              (piVar15,piVar5,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)piVar5 - (long)piVar15 < 0x41) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<IrSim::buildBB()::__0>>
                (piVar15,piVar5);
    }
    else {
      piVar19 = piVar15 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<IrSim::buildBB()::__0>>
                (piVar15,piVar19);
      for (; piVar19 != piVar5; piVar19 = piVar19 + 1) {
        iVar17 = *piVar19;
        iVar2 = piVar19[-1];
        piVar15 = piVar19;
        while (iVar17 <= iVar2) {
          *piVar15 = iVar2;
          piVar1 = piVar15 + -2;
          piVar15 = piVar15 + -1;
          iVar2 = *piVar1;
        }
        *piVar15 = iVar17;
      }
    }
  }
  _Var10 = std::
           __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     ((this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  piVar15 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((_Var10._M_current != piVar15) &&
     (piVar3 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
     piVar11 = (pointer)((long)_Var10._M_current + ((long)piVar3 - (long)piVar15)),
     piVar3 != piVar11)) {
    (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar11;
  }
  if ((this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("!basicBlocks.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                  ,0x4d,"void IrSim::buildBB()");
  }
  local_50 = (vector<int,std::allocator<int>> *)&this->basicBlocks;
  for (p_Var12 = (this->labelInBB)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != &(this->labelInBB)._M_t._M_impl.super__Rb_tree_header;
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    _Var10 = std::
             __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                       ((this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,p_Var12 + 1);
    *(int *)&p_Var12[1].field_0x4 =
         (int)((ulong)((long)_Var10._M_current -
                      (long)(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 2);
  }
  iVar2 = (int)((ulong)((long)(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar17 = iVar2 + -1;
  this_00 = &this->edges;
  std::
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  ::resize(this_00,(long)iVar17);
  local_58 = 0;
  if (1 < iVar2) {
    local_48 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)&this->labelInBB;
    local_40 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->functions;
    do {
      pIVar8 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = (long)local_58;
      lVar16 = (long)(this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar13 + 1];
      pIVar18 = pIVar8 + lVar16;
      iVar2 = pIVar8[lVar16 + -1].kind;
      if ((iVar2 - 0x14U < 8) || (iVar2 == 0xe)) {
        psVar6 = (this_00->
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&this->labels,&pIVar18[-1].target.value);
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)local_48,pmVar7);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   (psVar6 + lVar13),pmVar7);
      }
      if (((int)((long)local_58 + 1) != iVar17) &&
         (sVar14 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)local_40,
                              (((_Vector_base<int,_std::allocator<int>_> *)&local_50->field_0x0)->
                              _M_impl).super__Vector_impl_data._M_start + (long)local_58 + 1),
         sVar14 == 0)) {
        this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                  ((this_00->
                   super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + local_58);
        if (pIVar18->kind == 0xe) {
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::operator[](&this->labels,&(pIVar18->target).value);
          pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)local_48,pmVar7);
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>(this_01,pmVar7);
        }
        else {
          local_54 = local_58 + 1;
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          _M_insert_unique<int>
                    ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)this_01,&local_54);
        }
      }
      local_58 = local_58 + 1;
    } while (local_58 < iVar17);
  }
  return;
}

Assistant:

void IrSim::buildBB() {
    int i = 0;
    for (auto it = irList.begin(); it != irList.end(); ++it, ++i) {
        int k = it->kind;
        if (k == IC_FUNC) {
            basicBlocks.push_back(i);
            functions.insert(i);
        }
        else if (isGoto(k)) {
            int labelNo = labels[it->target.value];
            labelInBB[labelNo] = (int)basicBlocks.size();
            basicBlocks.push_back(labelNo);
            basicBlocks.push_back(i + 1);
        }
    }
    basicBlocks.push_back((int)irList.size());
    std::sort(basicBlocks.begin(), basicBlocks.end(), [](int a, int b) { return a <= b; });
    auto last = std::unique(basicBlocks.begin(), basicBlocks.end());
    basicBlocks.erase(last, basicBlocks.end());
    assert(!basicBlocks.empty());

    for (auto &it : labelInBB)
        it.second = (int)(find(basicBlocks.begin(), basicBlocks.end(), it.first) - basicBlocks.begin());
    int size = (int)basicBlocks.size() - 1;
    edges.resize((size_t)size);
    for (i = 0; i < size; ++i) { // build edges
        InterCode &bbend = irList[basicBlocks[i + 1] - 1];
        InterCode &bbnext = irList[basicBlocks[i + 1]];
        if (isGoto(bbend.kind))
            edges[i].insert(labelInBB[labels[bbend.target.value]]);
        if (i + 1 != size && functions.count(basicBlocks[i + 1]) == 0) {
            if (bbnext.kind == IC_GOTO)
                edges[i].insert(labelInBB[labels[bbnext.target.value]]);
            else
                edges[i].insert(i + 1);
        }
    }
}